

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satMem.c
# Opt level: O2

void Sat_MmFixedStop(Sat_MmFixed_t *p,int fVerbose)

{
  char *__ptr;
  long lVar1;
  
  if (p != (Sat_MmFixed_t *)0x0) {
    if (fVerbose != 0) {
      printf("Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
             (ulong)(uint)p->nEntrySize,(ulong)(uint)p->nChunkSize,(ulong)(uint)p->nChunks);
      printf("   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
             (ulong)(uint)p->nEntriesUsed,(ulong)(uint)p->nEntriesMax,
             (ulong)(uint)(p->nEntrySize * p->nEntriesUsed),(ulong)(uint)p->nMemoryAlloc);
    }
    for (lVar1 = 0; lVar1 < p->nChunks; lVar1 = lVar1 + 1) {
      __ptr = p->pChunks[lVar1];
      if (__ptr != (char *)0x0) {
        free(__ptr);
        p->pChunks[lVar1] = (char *)0x0;
      }
    }
    free(p->pChunks);
    free(p);
    return;
  }
  return;
}

Assistant:

void Sat_MmFixedStop( Sat_MmFixed_t * p, int fVerbose )
{
    int i;
    if ( p == NULL )
        return;
    if ( fVerbose )
    {
        printf( "Fixed memory manager: Entry = %5d. Chunk = %5d. Chunks used = %5d.\n",
            p->nEntrySize, p->nChunkSize, p->nChunks );
        printf( "   Entries used = %8d. Entries peak = %8d. Memory used = %8d. Memory alloc = %8d.\n",
            p->nEntriesUsed, p->nEntriesMax, p->nEntrySize * p->nEntriesUsed, p->nMemoryAlloc );
    }
    for ( i = 0; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    ABC_FREE( p->pChunks );
    ABC_FREE( p );
}